

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

void idx2::InverseCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  grid *Grid;
  ulong uVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double local_1018;
  double local_1000;
  double local_fe8;
  double local_fd0;
  double local_fb8;
  double local_fa0;
  anon_union_8_4_6ba14846_for_v2<int>_1 aStack_f08;
  int D_1;
  grid_iterator<unsigned_char> It_9;
  grid_iterator<unsigned_char> ItEnd_9;
  grid_iterator<signed_char> It_8;
  grid_iterator<signed_char> ItEnd_8;
  grid_iterator<unsigned_short> It_7;
  grid_iterator<unsigned_short> ItEnd_7;
  grid_iterator<short> It_6;
  grid_iterator<short> ItEnd_6;
  grid_iterator<unsigned_int> It_5;
  grid_iterator<unsigned_int> ItEnd_5;
  grid_iterator<int> It_4;
  grid_iterator<int> ItEnd_4;
  grid_iterator<unsigned_long> It_3;
  grid_iterator<unsigned_long> ItEnd_3;
  grid_iterator<long> It_2;
  grid_iterator<long> ItEnd_2;
  grid_iterator<float> It_1;
  grid_iterator<float> ItEnd_1;
  grid_iterator<double> It;
  grid_iterator<double> ItEnd;
  f64 W;
  f64 Idx2;
  f64 Wy;
  f64 Wx;
  subband *S;
  int I;
  wav_basis_norms_static<16> BasisNorms;
  undefined1 local_958 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:354:5)>
  __ScopeGuard__354;
  anon_class_8_1_6ff4743c_for_Func __CleanUpFunc__354;
  array<idx2::subband> Subbands;
  int D;
  int Iteration;
  grid G;
  v3i S3;
  v3i R3;
  v3i D3;
  u64 PrevOrder;
  int Level;
  stack_array<int,_32> StackAxes;
  stack_array<idx2::grid,_32> StackGrids;
  bool Normalize_local;
  volume *Vol_local;
  u64 TformOrder_local;
  int NLevels_local;
  int Iter_local;
  v3i *M3_local;
  v3i *Dims3_local;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined4 local_4e4;
  v3i *local_4e0;
  int *local_4d8;
  undefined4 local_4cc;
  undefined4 *local_4c8;
  undefined1 *local_4c0;
  int *local_4b8;
  undefined1 *local_4b0;
  int *local_4a8;
  undefined1 *local_4a0;
  int *local_498;
  int local_48c;
  int *local_488;
  int local_47c;
  int *local_478;
  int local_46c;
  int *local_468;
  int local_45c;
  int *local_458;
  int local_44c;
  int *local_448;
  int local_43c;
  int *local_438;
  int local_42c;
  int *local_428;
  int local_41c;
  int *local_418;
  int local_40c;
  int *local_408;
  int local_3fc;
  int *local_3f8;
  int local_3ec;
  int *local_3e8;
  int local_3dc;
  int *local_3d8;
  int local_3cc;
  int *local_3c8;
  int local_3bc;
  int *local_3b8;
  int local_3ac;
  int *local_3a8;
  int local_39c;
  int *local_398;
  int local_38c;
  int *local_388;
  int local_37c;
  int *local_378;
  int local_36c;
  int *local_368;
  int local_35c;
  int *local_358;
  int local_34c;
  int *local_348;
  int local_33c;
  int *local_338;
  int local_32c;
  int *local_328;
  int local_31c;
  int *local_318;
  int local_30c;
  int *local_308;
  int local_2fc;
  int *local_2f8;
  int local_2ec;
  int *local_2e8;
  int local_2dc;
  int *local_2d8;
  int local_2cc;
  int *local_2c8;
  int local_2bc;
  int *local_2b8;
  int local_2ac;
  int *local_2a8;
  int local_29c;
  long local_298;
  int local_28c;
  long local_288;
  uint local_27c;
  undefined1 *local_278;
  uint local_26c;
  undefined1 *local_268;
  uint local_25c;
  undefined1 *local_258;
  uint local_24c;
  undefined1 *local_248;
  uint local_23c;
  undefined1 *local_238;
  uint local_22c;
  undefined1 *local_228;
  ulong local_220;
  anon_class_8_1_6ff4743c_for_Func *local_218;
  long local_210;
  anon_class_8_1_6ff4743c_for_Func *local_208;
  int local_1fc;
  u8 *local_1f8;
  int local_1ec;
  undefined1 *local_1e8;
  int local_1dc;
  u8 *local_1d8;
  int local_1cc;
  undefined1 *local_1c8;
  int local_1bc;
  u8 *local_1b8;
  int local_1ac;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  mallocator *local_60;
  array<idx2::subband> *local_58;
  v3i *local_50;
  int *local_48;
  v3i *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined4 *local_20;
  mallocator *local_18;
  array<idx2::subband> *local_10;
  
  StackGrids._775_1_ = Normalize;
  stack_array<idx2::grid,_32>::stack_array((stack_array<idx2::grid,_32> *)(StackAxes.Arr + 0x1f));
  stack_array<int,_32>::stack_array((stack_array<int,_32> *)((long)&PrevOrder + 4));
  PrevOrder._0_4_ = 0;
  uVar3 = *(undefined8 *)&Dims3->field_0;
  uVar1 = *(uint *)((long)&Dims3->field_0 + 8);
  G.Strd._4_4_ = 1;
  S3.field_0.field_0.X = 1;
  G.super_extent.From =
       (long)(int)((Dims3->field_0).field_0.X & 0x1fffff) +
       (long)(int)((Dims3->field_0).field_0.Y & 0x1fffff) * 0x200000 +
       ((long)(int)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a);
  local_4cc = 1;
  local_4ec = 1;
  local_4e8 = 1;
  local_4e4 = 1;
  G.super_extent.Dims = 0x40000200001;
  Subbands.Alloc._4_4_ = 0;
  D3.field_0.field_4.YZ.field_0 = (v2<int>)TformOrder;
  Vol_local = (volume *)TformOrder;
  while( true ) {
    while( true ) {
      S3.field_0._4_8_ = uVar3;
      R3.field_0.field_0.X = uVar1;
      R3.field_0._4_8_ = uVar3;
      local_4e0 = Dims3;
      local_4d8 = &D;
      local_4c8 = &local_4ec;
      local_50 = Dims3;
      local_48 = &D;
      local_40 = Dims3;
      local_20 = &local_4ec;
      if (NLevels <= (int)PrevOrder) {
        if ((0 < NLevels) && ((StackGrids._775_1_ & 1) != 0)) {
          local_60 = Mallocator();
          local_58 = (array<idx2::subband> *)&__CleanUpFunc__354;
          local_18 = Mallocator();
          __CleanUpFunc__354.Subbands = (array<idx2::subband> *)0x0;
          __ScopeGuard__354._8_8_ = (array<idx2::subband> *)&__CleanUpFunc__354;
          local_10 = (array<idx2::subband> *)&__CleanUpFunc__354;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Wavelet.cpp:354:5)>
          ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:354:5)>
                         *)local_958,
                        (anon_class_8_1_6ff4743c_for_Func *)&__ScopeGuard__354.Dismissed);
          BuildSubbands(Dims3,NLevels,(u64)Vol_local,(array<idx2::subband> *)&__CleanUpFunc__354);
          GetCdf53NormsFast<16>();
          for (S._4_4_ = 0; local_218 = &__CleanUpFunc__354, S._4_4_ < 0; S._4_4_ = S._4_4_ + 1) {
            local_210 = (long)S._4_4_;
            local_208 = &__CleanUpFunc__354;
            Grid = (grid *)((long)__CleanUpFunc__354.Subbands + local_210 * 0x40);
            if ((Dims3->field_0).field_0.X == 1) {
              local_fa0 = 1.0;
            }
            else {
              if (*(char *)((long)&Grid[2].super_extent.From + 6) == '\0') {
                local_1a8 = &stack0xfffffffffffff588;
                local_1ac = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 3) +
                            -1;
                if (0xf < local_1ac) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_fb8 = *(double *)(local_1a8 + (long)local_1ac * 8);
              }
              else {
                local_1b8 = &BasisNorms.ScalNorms.Len;
                local_1bc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 3);
                if (0xf < local_1bc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_fb8 = *(double *)(local_1b8 + (long)local_1bc * 8);
              }
              local_fa0 = local_fb8;
            }
            if ((Dims3->field_0).field_0.Y == 1) {
              local_fd0 = 1.0;
            }
            else {
              if (*(char *)((long)&Grid[2].super_extent.From + 7) == '\0') {
                local_1c8 = &stack0xfffffffffffff588;
                local_1cc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 4) +
                            -1;
                if (0xf < local_1cc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_fe8 = *(double *)(local_1c8 + (long)local_1cc * 8);
              }
              else {
                local_1d8 = &BasisNorms.ScalNorms.Len;
                local_1dc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 4);
                if (0xf < local_1dc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_fe8 = *(double *)(local_1d8 + (long)local_1dc * 8);
              }
              local_fd0 = local_fe8;
            }
            if ((Dims3->field_0).field_0.Z == 1) {
              local_1000 = 1.0;
            }
            else {
              if ((char)Grid[2].super_extent.Dims == '\0') {
                local_1e8 = &stack0xfffffffffffff588;
                local_1ec = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 5) +
                            -1;
                if (0xf < local_1ec) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_1018 = *(double *)(local_1e8 + (long)local_1ec * 8);
              }
              else {
                local_1f8 = &BasisNorms.ScalNorms.Len;
                local_1fc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 5);
                if (0xf < local_1fc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_1018 = *(double *)(local_1f8 + (long)local_1fc * 8);
              }
              local_1000 = local_1018;
            }
            dVar9 = 1.0 / (local_fa0 * local_fd0 * local_1000);
            if (Vol->Type == float64) {
              End<double>((grid_iterator<double> *)((long)&It.N.field_0.field_3.XY.field_0 + 4),Grid
                          ,Vol);
              Begin<double>((grid_iterator<double> *)
                            ((long)&ItEnd_1.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_198 = (undefined1 *)((long)&ItEnd_1.N.field_0 + 4);
                local_1a0 = (undefined1 *)((long)&It.N.field_0 + 4);
                if (ItEnd_1.N.field_0.field_4.YZ.field_0 == It.N.field_0.field_4.YZ.field_0) break;
                local_188 = (undefined1 *)((long)&ItEnd_1.N.field_0 + 4);
                local_190 = (undefined1 *)((long)&ItEnd_1.N.field_0 + 4);
                *(double *)ItEnd_1.N.field_0.field_4.YZ.field_0 =
                     *(double *)ItEnd_1.N.field_0.field_4.YZ.field_0 * dVar9;
                grid_iterator<double>::operator++
                          ((grid_iterator<double> *)
                           ((long)&ItEnd_1.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == float32) {
              End<float>((grid_iterator<float> *)((long)&It_1.N.field_0.field_3.XY.field_0 + 4),Grid
                         ,Vol);
              Begin<float>((grid_iterator<float> *)((long)&ItEnd_2.N.field_0.field_3.XY.field_0 + 4)
                           ,Grid,Vol);
              while( true ) {
                local_178 = (undefined1 *)((long)&ItEnd_2.N.field_0 + 4);
                local_180 = (undefined1 *)((long)&It_1.N.field_0 + 4);
                if (ItEnd_2.N.field_0.field_4.YZ.field_0 == It_1.N.field_0.field_4.YZ.field_0)
                break;
                local_168 = (undefined1 *)((long)&ItEnd_2.N.field_0 + 4);
                local_170 = (undefined1 *)((long)&ItEnd_2.N.field_0 + 4);
                *(float *)ItEnd_2.N.field_0.field_4.YZ.field_0 =
                     (float)((double)*(float *)ItEnd_2.N.field_0.field_4.YZ.field_0 * dVar9);
                grid_iterator<float>::operator++
                          ((grid_iterator<float> *)((long)&ItEnd_2.N.field_0.field_3.XY.field_0 + 4)
                          );
              }
            }
            else if (Vol->Type == int64) {
              End<long>((grid_iterator<long> *)((long)&It_2.N.field_0.field_3.XY.field_0 + 4),Grid,
                        Vol);
              Begin<long>((grid_iterator<long> *)((long)&ItEnd_3.N.field_0.field_3.XY.field_0 + 4),
                          Grid,Vol);
              while( true ) {
                local_158 = (undefined1 *)((long)&ItEnd_3.N.field_0 + 4);
                local_160 = (undefined1 *)((long)&It_2.N.field_0 + 4);
                if (ItEnd_3.N.field_0.field_4.YZ.field_0 == It_2.N.field_0.field_4.YZ.field_0)
                break;
                local_148 = (undefined1 *)((long)&ItEnd_3.N.field_0 + 4);
                local_150 = (undefined1 *)((long)&ItEnd_3.N.field_0 + 4);
                *(long *)ItEnd_3.N.field_0.field_4.YZ.field_0 =
                     (long)((double)*(long *)ItEnd_3.N.field_0.field_4.YZ.field_0 * dVar9);
                grid_iterator<long>::operator++
                          ((grid_iterator<long> *)((long)&ItEnd_3.N.field_0.field_3.XY.field_0 + 4))
                ;
              }
            }
            else if (Vol->Type == uint64) {
              End<unsigned_long>((grid_iterator<unsigned_long> *)
                                 ((long)&It_3.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_long>
                        ((grid_iterator<unsigned_long> *)
                         ((long)&ItEnd_4.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_138 = (undefined1 *)((long)&ItEnd_4.N.field_0 + 4);
                local_140 = (undefined1 *)((long)&It_3.N.field_0 + 4);
                if (ItEnd_4.N.field_0.field_4.YZ.field_0 == It_3.N.field_0.field_4.YZ.field_0)
                break;
                local_128 = (undefined1 *)((long)&ItEnd_4.N.field_0 + 4);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)ItEnd_4.N.field_0.field_4.YZ.field_0;
                auVar10 = vpunpckldq_avx(auVar10,_DAT_002accb0);
                auVar10 = vsubpd_avx(auVar10,_DAT_002accc0);
                auVar5 = vpermilpd_avx(auVar10,1);
                dVar4 = (auVar5._0_8_ + auVar10._0_8_) * dVar9;
                uVar7 = (ulong)dVar4;
                local_130 = (undefined1 *)((long)&ItEnd_4.N.field_0 + 4);
                *(ulong *)ItEnd_4.N.field_0.field_4.YZ.field_0 =
                     uVar7 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f;
                grid_iterator<unsigned_long>::operator++
                          ((grid_iterator<unsigned_long> *)
                           ((long)&ItEnd_4.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == int32) {
              End<int>((grid_iterator<int> *)((long)&It_4.N.field_0.field_3.XY.field_0 + 4),Grid,Vol
                      );
              Begin<int>((grid_iterator<int> *)((long)&ItEnd_5.N.field_0.field_3.XY.field_0 + 4),
                         Grid,Vol);
              while( true ) {
                local_118 = (undefined1 *)((long)&ItEnd_5.N.field_0 + 4);
                local_120 = (undefined1 *)((long)&It_4.N.field_0 + 4);
                if (ItEnd_5.N.field_0.field_4.YZ.field_0 == It_4.N.field_0.field_4.YZ.field_0)
                break;
                local_108 = (undefined1 *)((long)&ItEnd_5.N.field_0 + 4);
                local_110 = (undefined1 *)((long)&ItEnd_5.N.field_0 + 4);
                *(int *)ItEnd_5.N.field_0.field_4.YZ.field_0 =
                     (int)((double)*(int *)ItEnd_5.N.field_0.field_4.YZ.field_0 * dVar9);
                grid_iterator<int>::operator++
                          ((grid_iterator<int> *)((long)&ItEnd_5.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == uint32) {
              End<unsigned_int>((grid_iterator<unsigned_int> *)
                                ((long)&It_5.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_int>((grid_iterator<unsigned_int> *)
                                  ((long)&ItEnd_6.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_f8 = (undefined1 *)((long)&ItEnd_6.N.field_0 + 4);
                local_100 = (undefined1 *)((long)&It_5.N.field_0 + 4);
                if (ItEnd_6.N.field_0.field_4.YZ.field_0 == It_5.N.field_0.field_4.YZ.field_0)
                break;
                local_e8 = (undefined1 *)((long)&ItEnd_6.N.field_0 + 4);
                local_f0 = (undefined1 *)((long)&ItEnd_6.N.field_0 + 4);
                *(int *)ItEnd_6.N.field_0.field_4.YZ.field_0 =
                     (int)(long)((double)*(uint *)ItEnd_6.N.field_0.field_4.YZ.field_0 * dVar9);
                grid_iterator<unsigned_int>::operator++
                          ((grid_iterator<unsigned_int> *)
                           ((long)&ItEnd_6.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == int16) {
              End<short>((grid_iterator<short> *)((long)&It_6.N.field_0.field_3.XY.field_0 + 4),Grid
                         ,Vol);
              Begin<short>((grid_iterator<short> *)((long)&ItEnd_7.N.field_0.field_3.XY.field_0 + 4)
                           ,Grid,Vol);
              while( true ) {
                local_d8 = (undefined1 *)((long)&ItEnd_7.N.field_0 + 4);
                local_e0 = (undefined1 *)((long)&It_6.N.field_0 + 4);
                if (ItEnd_7.N.field_0.field_4.YZ.field_0 == It_6.N.field_0.field_4.YZ.field_0)
                break;
                local_c8 = (undefined1 *)((long)&ItEnd_7.N.field_0 + 4);
                local_d0 = (undefined1 *)((long)&ItEnd_7.N.field_0 + 4);
                *(short *)ItEnd_7.N.field_0.field_4.YZ.field_0 =
                     (short)(int)((double)(int)*(short *)ItEnd_7.N.field_0.field_4.YZ.field_0 *
                                 dVar9);
                grid_iterator<short>::operator++
                          ((grid_iterator<short> *)((long)&ItEnd_7.N.field_0.field_3.XY.field_0 + 4)
                          );
              }
            }
            else if (Vol->Type == uint16) {
              End<unsigned_short>((grid_iterator<unsigned_short> *)
                                  ((long)&It_7.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_short>
                        ((grid_iterator<unsigned_short> *)
                         ((long)&ItEnd_8.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_b8 = (undefined1 *)((long)&ItEnd_8.N.field_0 + 4);
                local_c0 = (undefined1 *)((long)&It_7.N.field_0 + 4);
                if (ItEnd_8.N.field_0.field_4.YZ.field_0 == It_7.N.field_0.field_4.YZ.field_0)
                break;
                local_a8 = (undefined1 *)((long)&ItEnd_8.N.field_0 + 4);
                local_b0 = (undefined1 *)((long)&ItEnd_8.N.field_0 + 4);
                *(short *)ItEnd_8.N.field_0.field_4.YZ.field_0 =
                     (short)(int)((double)*(ushort *)ItEnd_8.N.field_0.field_4.YZ.field_0 * dVar9);
                grid_iterator<unsigned_short>::operator++
                          ((grid_iterator<unsigned_short> *)
                           ((long)&ItEnd_8.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == int8) {
              End<signed_char>((grid_iterator<signed_char> *)
                               ((long)&It_8.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<signed_char>((grid_iterator<signed_char> *)
                                 ((long)&ItEnd_9.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_98 = (undefined1 *)((long)&ItEnd_9.N.field_0 + 4);
                local_a0 = (undefined1 *)((long)&It_8.N.field_0 + 4);
                if (ItEnd_9.N.field_0.field_4.YZ.field_0 == It_8.N.field_0.field_4.YZ.field_0)
                break;
                local_88 = (undefined1 *)((long)&ItEnd_9.N.field_0 + 4);
                local_90 = (undefined1 *)((long)&ItEnd_9.N.field_0 + 4);
                *(char *)ItEnd_9.N.field_0.field_4.YZ.field_0 =
                     (char)(int)((double)(int)*(char *)ItEnd_9.N.field_0.field_4.YZ.field_0 * dVar9)
                ;
                grid_iterator<signed_char>::operator++
                          ((grid_iterator<signed_char> *)
                           ((long)&ItEnd_9.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == uint8) {
              End<unsigned_char>((grid_iterator<unsigned_char> *)
                                 ((long)&It_9.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_char>
                        ((grid_iterator<unsigned_char> *)&stack0xfffffffffffff0f8,Grid,Vol);
              while( true ) {
                local_78 = (undefined1 *)&stack0xfffffffffffff0f8;
                local_80 = (undefined1 *)((long)&It_9.N.field_0 + 4);
                if (aStack_f08 ==
                    (anon_union_8_4_6ba14846_for_v2<int>_1)It_9.N.field_0.field_4.YZ.field_0) break;
                local_68 = (undefined1 *)&stack0xfffffffffffff0f8;
                local_70 = (undefined1 *)&stack0xfffffffffffff0f8;
                *(byte *)aStack_f08 = (byte)(int)((double)*(byte *)aStack_f08 * dVar9);
                grid_iterator<unsigned_char>::operator++
                          ((grid_iterator<unsigned_char> *)&stack0xfffffffffffff0f8);
              }
            }
          }
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Wavelet.cpp:354:5)>
          ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:354:5)>
                          *)local_958);
        }
        while( true ) {
          local_29c = Subbands.Alloc._4_4_ + -1;
          if (Subbands.Alloc._4_4_ < 1) {
            return;
          }
          local_298 = (long)&PrevOrder + 4;
          if (0x1f < local_29c) break;
          iVar2 = *(int *)(local_298 + (long)local_29c * 4);
          Subbands.Alloc._4_4_ = local_29c;
          if (Vol->Type == float64) {
            if (iVar2 == 0) {
              local_2b8 = StackAxes.Arr + 0x1f;
              local_2bc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_2b8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_2c8 = StackAxes.Arr + 0x1f;
              local_2cc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_2c8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_2d8 = StackAxes.Arr + 0x1f;
              local_2dc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_2d8 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == float32) {
            if (iVar2 == 0) {
              local_2e8 = StackAxes.Arr + 0x1f;
              local_2ec = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_2e8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_2f8 = StackAxes.Arr + 0x1f;
              local_2fc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_2f8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_308 = StackAxes.Arr + 0x1f;
              local_30c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_308 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == int64) {
            if (iVar2 == 0) {
              local_318 = StackAxes.Arr + 0x1f;
              local_31c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_318 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_328 = StackAxes.Arr + 0x1f;
              local_32c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_328 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_338 = StackAxes.Arr + 0x1f;
              local_33c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_338 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == uint64) {
            if (iVar2 == 0) {
              local_348 = StackAxes.Arr + 0x1f;
              local_34c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_348 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_358 = StackAxes.Arr + 0x1f;
              local_35c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_358 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_368 = StackAxes.Arr + 0x1f;
              local_36c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_368 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == int32) {
            if (iVar2 == 0) {
              local_378 = StackAxes.Arr + 0x1f;
              local_37c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_378 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_388 = StackAxes.Arr + 0x1f;
              local_38c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_388 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_398 = StackAxes.Arr + 0x1f;
              local_39c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_398 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == uint32) {
            if (iVar2 == 0) {
              local_3a8 = StackAxes.Arr + 0x1f;
              local_3ac = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_3a8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_3b8 = StackAxes.Arr + 0x1f;
              local_3bc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_3b8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_3c8 = StackAxes.Arr + 0x1f;
              local_3cc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_3c8 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == int16) {
            if (iVar2 == 0) {
              local_3d8 = StackAxes.Arr + 0x1f;
              local_3dc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_3d8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_3e8 = StackAxes.Arr + 0x1f;
              local_3ec = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_3e8 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_3f8 = StackAxes.Arr + 0x1f;
              local_3fc = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_3f8 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == uint16) {
            if (iVar2 == 0) {
              local_408 = StackAxes.Arr + 0x1f;
              local_40c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_408 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_418 = StackAxes.Arr + 0x1f;
              local_41c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_418 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_428 = StackAxes.Arr + 0x1f;
              local_42c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_428 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == int8) {
            if (iVar2 == 0) {
              local_438 = StackAxes.Arr + 0x1f;
              local_43c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_438 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_448 = StackAxes.Arr + 0x1f;
              local_44c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_448 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_458 = StackAxes.Arr + 0x1f;
              local_45c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_458 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
          else if (Vol->Type == uint8) {
            if (iVar2 == 0) {
              local_468 = StackAxes.Arr + 0x1f;
              local_46c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53X<double>((grid *)(local_468 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 1) {
              local_478 = StackAxes.Arr + 0x1f;
              local_47c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Y<double>((grid *)(local_478 + (long)local_29c * 6),M3,Normal,Vol);
            }
            else if (iVar2 == 2) {
              local_488 = StackAxes.Arr + 0x1f;
              local_48c = local_29c;
              if (0x1f < local_29c) {
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                             );
              }
              ILiftCdf53Z<double>((grid *)(local_488 + (long)local_29c * 6),M3,Normal,Vol);
            }
          }
        }
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]");
      }
      uVar6 = (uint)Vol_local & 3;
      Vol_local = (volume *)((ulong)Vol_local >> 2);
      R3.field_0.field_0.Y = (int)uVar3;
      R3.field_0.field_0.Z = (int)((ulong)uVar3 >> 0x20);
      if (uVar6 != 3) break;
      if ((anon_union_8_4_6ba14846_for_v2<int>_1)Vol_local ==
          (anon_union_8_4_6ba14846_for_v2<int>_1)0x3) {
        Vol_local = (volume *)D3.field_0.field_4.YZ.field_0;
      }
      D3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)Vol_local;
      local_4b8 = &D;
      local_4c0 = (undefined1 *)((long)&G.Strd + 4);
      G.super_extent.Dims =
           (long)(int)(G.Strd._4_4_ & 0x1fffff) + 0x200000 +
           ((long)(int)(S3.field_0.field_0.X & 0x1fffff) << 0x2a);
      local_498 = &D;
      local_4a0 = (undefined1 *)((long)&R3.field_0 + 4);
      G.super_extent.From =
           (long)(int)(R3.field_0.field_0.Y & 0x1fffff) +
           (long)(int)(R3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
           ((long)(int)(uVar1 & 0x1fffff) << 0x2a);
      PrevOrder._0_4_ = (int)PrevOrder + 1;
      Vol_local = (volume *)D3.field_0.field_4.YZ.field_0;
      local_38 = local_4a0;
      local_28 = local_4c0;
    }
    local_2a8 = StackAxes.Arr + 0x1f;
    local_2ac = Subbands.Alloc._4_4_;
    if (0x1f < Subbands.Alloc._4_4_) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                   );
    }
    lVar8 = (long)Subbands.Alloc._4_4_;
    *(undefined8 *)(local_2a8 + lVar8 * 6) = 0;
    StackGrids.Arr[lVar8].super_extent.From = G.super_extent.From;
    StackGrids.Arr[lVar8].super_extent.Dims = G.super_extent.Dims;
    local_288 = (long)&PrevOrder + 4;
    local_28c = Subbands.Alloc._4_4_;
    if (0x1f < Subbands.Alloc._4_4_) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]")
      ;
    }
    *(uint *)(local_288 + (long)Subbands.Alloc._4_4_ * 4) = uVar6;
    local_228 = (undefined1 *)((long)&R3.field_0 + 4);
    local_22c = uVar6;
    if (2 < uVar6) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_238 = (undefined1 *)((long)&R3.field_0 + 4);
    local_23c = uVar6;
    if (2 < uVar6) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_220 = (ulong)*(int *)(local_238 + (long)(int)uVar6 * 4);
    local_248 = (undefined1 *)((long)&S3.field_0 + 4);
    local_24c = uVar6;
    if (2 < uVar6) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(uint *)(local_248 + (long)(int)uVar6 * 4) =
         *(int *)(local_228 + (long)(int)uVar6 * 4) + (uint)((local_220 & 1) == 0);
    local_4a8 = &D;
    local_4b0 = (undefined1 *)((long)&S3.field_0 + 4);
    G.super_extent.From =
         (long)(int)(R3.field_0.field_0.Y & 0x1fffff) +
         (long)(int)(R3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
         ((long)(int)(uVar1 & 0x1fffff) << 0x2a);
    local_258 = (undefined1 *)((long)&S3.field_0 + 4);
    local_25c = uVar6;
    local_30 = local_4b0;
    if (2 < uVar6) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_268 = (undefined1 *)((long)&R3.field_0 + 4);
    local_26c = uVar6;
    if (2 < uVar6) break;
    *(int *)(local_268 + (long)(int)uVar6 * 4) = *(int *)(local_258 + (long)(int)uVar6 * 4) + 1 >> 1
    ;
    local_278 = (undefined1 *)((long)&G.Strd + 4);
    local_27c = uVar6;
    if (2 < uVar6) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)(local_278 + (long)(int)uVar6 * 4) = *(int *)(local_278 + (long)(int)uVar6 * 4) << 1;
    Subbands.Alloc._4_4_ = Subbands.Alloc._4_4_ + 1;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

void
InverseCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  /* "simulate" the forward transform */
  stack_array<grid, 32> StackGrids;
  stack_array<int, 32> StackAxes;
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  int Iteration = 0;
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
      StackGrids[Iteration] = G;
      StackAxes[Iteration++] = D;
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* inverse normalize if required */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }

  /* perform the inverse transform */
  while (Iteration-- > 0)
  {
    int D = StackAxes[Iteration];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}